

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall gl4cts::TextureFilterMinmaxUtils::Texture3D::Texture3D(Texture3D *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"vec3",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"sampler3D",&local_4a);
  SupportedTextureType::SupportedTextureType
            (&this->super_SupportedTextureType,0x806f,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_SupportedTextureType)._vptr_SupportedTextureType =
       (_func_int **)&PTR_getTextureGL_01dda1f8;
  (this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.m_data.ptr
       = (Texture3D *)0x0;
  return;
}

Assistant:

TextureFilterMinmaxUtils::Texture3D::Texture3D() : SupportedTextureType(GL_TEXTURE_3D, "vec3", "sampler3D")
{
}